

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O0

ZipEntry __thiscall
Zippy::ZipArchive::AddEntryImpl(ZipArchive *this,string *name,ZipEntryData *data)

{
  bool bVar1;
  char *__s;
  size_type sVar2;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  this_00;
  reference entry;
  reference entry_00;
  ZipEntry *extraout_RDX;
  ZipArchive *in_RSI;
  ZipEntry *in_RDI;
  ZipEntry ZVar3;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> folder;
  int pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  string *in_stack_fffffffffffff588;
  ZipEntry *in_stack_fffffffffffff590;
  ZipEntry *in_stack_fffffffffffff598;
  ZipEntry *__args;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff5a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff5a8;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  in_stack_fffffffffffff5b0;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  in_stack_fffffffffffff5b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff5c0;
  char *in_stack_fffffffffffff5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 in_stack_fffffffffffff656;
  undefined1 in_stack_fffffffffffff657;
  ZipArchive *in_stack_fffffffffffff658;
  ZipEntryData *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffa18;
  ZipEntry *in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa28;
  ZipEntry *in_stack_fffffffffffffa30;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  local_568;
  ZipEntry local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  int local_74;
  undefined1 local_70 [112];
  
  bVar1 = IsOpen(in_RSI);
  if (bVar1) {
    GetEntryNames_abi_cxx11_
              (in_stack_fffffffffffff658,(bool)in_stack_fffffffffffff657,
               (bool)in_stack_fffffffffffff656);
    local_74 = 0;
    while (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(in_stack_fffffffffffff5d0,(char)((ulong)in_stack_fffffffffffff5c8 >> 0x38),
                        (size_type)in_stack_fffffffffffff5c0._M_current),
          sVar2 != 0xffffffffffffffff) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (in_stack_fffffffffffff5d0,(char)((ulong)in_stack_fffffffffffff5c8 >> 0x38),
                         (size_type)in_stack_fffffffffffff5c0._M_current);
      local_74 = (int)sVar2 + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffff5a8._M_current,
                 (size_type)in_stack_fffffffffffff5a0._M_current,
                 (size_type)in_stack_fffffffffffff598);
      in_stack_fffffffffffff5b8._M_current = (ZipEntry *)local_70;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff588);
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff588);
      in_stack_fffffffffffff5c0 =
           std::
           find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                     (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff598);
      local_a0 = in_stack_fffffffffffff5c0._M_current;
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff588);
      bVar1 = __gnu_cxx::
              operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff590,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff588);
      if (bVar1) {
        in_stack_fffffffffffff5a8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_RSI->m_ZipEntries;
        in_stack_fffffffffffff5b0._M_current = &local_559;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,
                   (allocator<char> *)in_stack_fffffffffffff5c0._M_current);
        Impl::ZipEntry::ZipEntry
                  (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                   (string *)in_stack_fffffffffffffa20);
        std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::
        emplace_back<Zippy::Impl::ZipEntry>
                  ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
                   in_stack_fffffffffffff5a0._M_current,in_stack_fffffffffffff598);
        Impl::ZipEntry::~ZipEntry((ZipEntry *)0x13ce75);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff590);
        std::allocator<char>::~allocator((allocator<char> *)&local_559);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff5a0._M_current,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff598);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff590);
    }
    __args = (ZipEntry *)&in_RSI->m_ZipEntries;
    std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::begin
              ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
               in_stack_fffffffffffff588);
    std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::end
              ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
               in_stack_fffffffffffff588);
    this_00 = std::
              find_if<__gnu_cxx::__normal_iterator<Zippy::Impl::ZipEntry*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>,Zippy::ZipArchive::AddEntryImpl(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(Zippy::Impl::ZipEntry_const&)_1_>
                        (in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                         (anon_class_8_1_898f2789_for__M_pred)in_stack_fffffffffffff5a8._M_current);
    local_568 = this_00;
    std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::end
              ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
               in_stack_fffffffffffff588);
    bVar1 = __gnu_cxx::
            operator==<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
                      ((__normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
                        *)in_stack_fffffffffffff590,
                       (__normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
                        *)in_stack_fffffffffffff588);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Impl::ZipEntry::ZipEntry
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      entry_00 = std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::
                 emplace_back<Zippy::Impl::ZipEntry>
                           ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *
                            )this_00._M_current,__args);
      ZipEntry::ZipEntry(in_RDI,entry_00);
      Impl::ZipEntry::~ZipEntry((ZipEntry *)0x13d0b4);
    }
    else {
      __gnu_cxx::
      __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
      ::operator->(&local_568);
      Impl::ZipEntry::SetData(in_stack_fffffffffffff590,(ZipEntryData *)in_stack_fffffffffffff588);
      entry = __gnu_cxx::
              __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
              ::operator*(&local_568);
      ZipEntry::ZipEntry(in_RDI,entry);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00._M_current);
    ZVar3.m_ZipEntry = extraout_RDX;
    ZVar3._vptr_ZipEntry = (_func_int **)in_RDI;
    return ZVar3;
  }
  local_70[0x1b] = 1;
  __s = (char *)__cxa_allocate_exception(0x10);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,__s,(allocator<char> *)in_stack_fffffffffffff5c0._M_current);
  ZipLogicError::ZipLogicError((ZipLogicError *)in_stack_fffffffffffff590,in_stack_fffffffffffff588)
  ;
  local_70[0x1b] = 0;
  __cxa_throw(__s,&ZipLogicError::typeinfo,ZipLogicError::~ZipLogicError);
}

Assistant:

ZipEntry AddEntryImpl(const std::string& name, const ZipEntryData& data) {

            if (!IsOpen()) throw ZipLogicError("Cannot call AddEntry on empty ZipArchive object!");

            // ===== Ensure that all folders and subfolders have an entry in the archive
            auto folders = GetEntryNames(true, false);
            auto pos = 0;
            while (name.find('/', pos) != std::string::npos) {
                pos = name.find('/', pos) + 1;
                auto folder = name.substr(0, pos);

                // ===== If folder isn't registered in the archive, add it.
                if (std::find(folders.begin(), folders.end(), folder) == folders.end()) {
                    m_ZipEntries.emplace_back(Impl::ZipEntry(folder, ""));
                    folders.emplace_back(folder);
                }
            }

            // ===== Check if an entry with the given name already exists in the archive.
            auto result = std::find_if(m_ZipEntries.begin(), m_ZipEntries.end(), [&](const Impl::ZipEntry& entry) {
                return name == entry.GetName();
            });

            // ===== If the entry exists, replace the existing data with the new data, and return the ZipEntry object.
            if (result != m_ZipEntries.end()) {
                result->SetData(data);
                return ZipEntry(&*result);
            }

            // ===== Finally, add a new entry with the given name and data, and return the object.
            return ZipEntry(&m_ZipEntries.emplace_back(Impl::ZipEntry(name, data)));
        }